

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O3

int __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::init(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       *this,EVP_PKEY_CTX *ctx)

{
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar1;
  undefined8 uVar2;
  int in_EAX;
  int extraout_EAX;
  SPxStatus SVar3;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int iVar4;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar5;
  SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar6;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<100U,_int,_void> local_168;
  cpp_dec_float<100U,_int,_void> local_110;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_c0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_70;
  
  if (this->initialized == false) {
    this->initialized = true;
    (*(this->
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x88])(this);
    in_EAX = (*(this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .
               super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._vptr_ClassArray[0x79])(this);
    if (((this->
         super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thestatus < SINGULAR) ||
       ((this->
        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).theLP != this)) {
      pSVar1 = &this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ;
      (this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).theLP = this;
      (this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).spxout = this->spxout;
      SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::setRep(pSVar1);
      SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::restoreInitialBasis(pSVar1);
      in_EAX = (*(this->
                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 )._vptr_SPxBasisBase[5])
                         (pSVar1,&(this->
                                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ).thedesc);
    }
    this->initialized = false;
  }
  pSVar1 = &this->
            super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ;
  if ((this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).matrixIsSetup == false) {
    SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::loadDesc(pSVar1,&(this->
                       super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).thedesc);
    in_EAX = extraout_EAX;
  }
  if ((this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thestatus == SINGULAR) {
    return in_EAX;
  }
  if ((this->thecovectors->set).thenum == 0) {
    (this->
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).factorized = true;
  }
  else if (((this->
            super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).factorized & 1U) == 0) {
    SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::factorize(pSVar1);
  }
  this->m_numCycle = 0;
  if (this->theType == ENTER) {
    if (this->theRep == COLUMN) {
      setPrimalBounds(this);
      if (this->m_status == OPTIMAL) {
        this->m_status = UNKNOWN;
      }
      SVar3 = PRIMAL;
      if ((this->
          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thestatus != PRIMAL) {
LAB_0039a446:
        (this->
        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).thestatus = SVar3;
      }
    }
    else {
      setDualRowBounds(this);
      if (this->m_status == OPTIMAL) {
        this->m_status = UNKNOWN;
      }
      SVar3 = DUAL;
      if ((this->
          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thestatus != DUAL) goto LAB_0039a446;
    }
    (*(this->
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x8d])(this);
    (*(this->
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x7c])(this);
    DIdxSet::setMax(&this->infeasibilities,(this->thecovectors->set).thenum);
    DIdxSet::setMax(&this->infeasibilitiesCo,(this->thevectors->set).thenum);
    DataArray<int>::reSize(&this->isInfeasible,(this->thecovectors->set).thenum);
    DataArray<int>::reSize(&this->isInfeasibleCo,(this->thevectors->set).thenum);
    pSVar6 = this->theratiotester;
    pnVar5 = &local_70;
    entertol(pnVar5,this);
    goto LAB_0039a4d6;
  }
  if (this->theRep == ROW) {
    setPrimalBounds(this);
    if (this->m_status == OPTIMAL) {
      this->m_status = UNKNOWN;
    }
    SVar3 = PRIMAL;
    if ((this->
        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).thestatus != PRIMAL) goto LAB_0039a358;
  }
  else {
    setDualColBounds(this);
    if (this->m_status == OPTIMAL) {
      this->m_status = UNKNOWN;
    }
    SVar3 = DUAL;
    if ((this->
        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).thestatus != DUAL) {
LAB_0039a358:
      (this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thestatus = SVar3;
    }
  }
  (*(this->
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x8e])(this);
  (*(this->
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x7d])(this);
  DIdxSet::setMax(&this->infeasibilities,(this->thecovectors->set).thenum);
  DataArray<int>::reSize(&this->isInfeasible,(this->thecovectors->set).thenum);
  pSVar6 = this->theratiotester;
  pnVar5 = &local_c0;
  leavetol(pnVar5,this);
LAB_0039a4d6:
  (*pSVar6->_vptr_SPxRatioTester[4])(pSVar6,pnVar5);
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::coSolve(pSVar1,&this->theCoPvec->
                    super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ,this->theCoPrhs);
  computePvec(this);
  computeFrhs(this);
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::solve(pSVar1,&this->theFvec->
                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ,this->theFrhs);
  pnVar5 = &this->theShift;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)pnVar5,0.0);
  if (this->theType == ENTER) {
    shiftFvec(this);
    entertol((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&local_110,this);
    local_168.fpclass = cpp_dec_float_finite;
    local_168.prec_elem = 0x10;
    local_168.data._M_elems[0] = 0;
    local_168.data._M_elems[1] = 0;
    local_168.data._M_elems[2] = 0;
    local_168.data._M_elems[3] = 0;
    local_168.data._M_elems[4] = 0;
    local_168.data._M_elems[5] = 0;
    local_168.data._M_elems[6] = 0;
    local_168.data._M_elems[7] = 0;
    local_168.data._M_elems[8] = 0;
    local_168.data._M_elems[9] = 0;
    local_168.data._M_elems[10] = 0;
    local_168.data._M_elems[0xb] = 0;
    local_168.data._M_elems[0xc] = 0;
    local_168.data._M_elems[0xd] = 0;
    local_168.data._M_elems._56_5_ = 0;
    local_168.data._M_elems[0xf]._1_3_ = 0;
    local_168.exp = 0;
    local_168.neg = false;
    if (&local_168 != &pnVar5->m_backend) {
      local_168.data._M_elems._0_8_ = *(undefined8 *)(pnVar5->m_backend).data._M_elems;
      local_168.data._M_elems._8_8_ = *(undefined8 *)((this->theShift).m_backend.data._M_elems + 2);
      local_168.data._M_elems._16_8_ = *(undefined8 *)((this->theShift).m_backend.data._M_elems + 4)
      ;
      local_168.data._M_elems._24_8_ = *(undefined8 *)((this->theShift).m_backend.data._M_elems + 6)
      ;
      local_168.data._M_elems._32_8_ = *(undefined8 *)((this->theShift).m_backend.data._M_elems + 8)
      ;
      local_168.data._M_elems._40_8_ =
           *(undefined8 *)((this->theShift).m_backend.data._M_elems + 10);
      local_168.data._M_elems._48_8_ =
           *(undefined8 *)((this->theShift).m_backend.data._M_elems + 0xc);
      uVar2 = *(undefined8 *)((this->theShift).m_backend.data._M_elems + 0xe);
      local_168.data._M_elems._56_5_ = SUB85(uVar2,0);
      local_168.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar2 >> 0x28);
      local_168.exp = (this->theShift).m_backend.exp;
      local_168.neg = (this->theShift).m_backend.neg;
      local_168.fpclass = (this->theShift).m_backend.fpclass;
      local_168.prec_elem = (this->theShift).m_backend.prec_elem;
    }
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
              (&local_168,&local_110);
    *(undefined8 *)(this->lastShift).m_backend.data._M_elems = local_168.data._M_elems._0_8_;
    *(undefined8 *)((this->lastShift).m_backend.data._M_elems + 2) = local_168.data._M_elems._8_8_;
    *(undefined8 *)((this->lastShift).m_backend.data._M_elems + 4) = local_168.data._M_elems._16_8_;
    *(undefined8 *)((this->lastShift).m_backend.data._M_elems + 6) = local_168.data._M_elems._24_8_;
    *(undefined8 *)((this->lastShift).m_backend.data._M_elems + 8) = local_168.data._M_elems._32_8_;
    *(undefined8 *)((this->lastShift).m_backend.data._M_elems + 10) = local_168.data._M_elems._40_8_
    ;
    *(undefined8 *)((this->lastShift).m_backend.data._M_elems + 0xc) =
         local_168.data._M_elems._48_8_;
    *(ulong *)((this->lastShift).m_backend.data._M_elems + 0xe) =
         CONCAT35(local_168.data._M_elems[0xf]._1_3_,local_168.data._M_elems._56_5_);
    (this->lastShift).m_backend.exp = local_168.exp;
    (this->lastShift).m_backend.neg = local_168.neg;
    (this->lastShift).m_backend.fpclass = local_168.fpclass;
    (this->lastShift).m_backend.prec_elem = local_168.prec_elem;
    computeCoTest(this);
    computeTest(this);
    iVar4 = extraout_EAX_01;
  }
  else {
    shiftPvec(this);
    leavetol((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&local_110,this);
    local_168.fpclass = cpp_dec_float_finite;
    local_168.prec_elem = 0x10;
    local_168.data._M_elems[0] = 0;
    local_168.data._M_elems[1] = 0;
    local_168.data._M_elems[2] = 0;
    local_168.data._M_elems[3] = 0;
    local_168.data._M_elems[4] = 0;
    local_168.data._M_elems[5] = 0;
    local_168.data._M_elems[6] = 0;
    local_168.data._M_elems[7] = 0;
    local_168.data._M_elems[8] = 0;
    local_168.data._M_elems[9] = 0;
    local_168.data._M_elems[10] = 0;
    local_168.data._M_elems[0xb] = 0;
    local_168.data._M_elems[0xc] = 0;
    local_168.data._M_elems[0xd] = 0;
    local_168.data._M_elems._56_5_ = 0;
    local_168.data._M_elems[0xf]._1_3_ = 0;
    local_168.exp = 0;
    local_168.neg = false;
    if (&local_168 != &pnVar5->m_backend) {
      local_168.data._M_elems._0_8_ = *(undefined8 *)(pnVar5->m_backend).data._M_elems;
      local_168.data._M_elems._8_8_ = *(undefined8 *)((this->theShift).m_backend.data._M_elems + 2);
      local_168.data._M_elems._16_8_ = *(undefined8 *)((this->theShift).m_backend.data._M_elems + 4)
      ;
      local_168.data._M_elems._24_8_ = *(undefined8 *)((this->theShift).m_backend.data._M_elems + 6)
      ;
      local_168.data._M_elems._32_8_ = *(undefined8 *)((this->theShift).m_backend.data._M_elems + 8)
      ;
      local_168.data._M_elems._40_8_ =
           *(undefined8 *)((this->theShift).m_backend.data._M_elems + 10);
      local_168.data._M_elems._48_8_ =
           *(undefined8 *)((this->theShift).m_backend.data._M_elems + 0xc);
      uVar2 = *(undefined8 *)((this->theShift).m_backend.data._M_elems + 0xe);
      local_168.data._M_elems._56_5_ = SUB85(uVar2,0);
      local_168.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar2 >> 0x28);
      local_168.exp = (this->theShift).m_backend.exp;
      local_168.neg = (this->theShift).m_backend.neg;
      local_168.fpclass = (this->theShift).m_backend.fpclass;
      local_168.prec_elem = (this->theShift).m_backend.prec_elem;
    }
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
              (&local_168,&local_110);
    *(undefined8 *)(this->lastShift).m_backend.data._M_elems = local_168.data._M_elems._0_8_;
    *(undefined8 *)((this->lastShift).m_backend.data._M_elems + 2) = local_168.data._M_elems._8_8_;
    *(undefined8 *)((this->lastShift).m_backend.data._M_elems + 4) = local_168.data._M_elems._16_8_;
    *(undefined8 *)((this->lastShift).m_backend.data._M_elems + 6) = local_168.data._M_elems._24_8_;
    *(undefined8 *)((this->lastShift).m_backend.data._M_elems + 8) = local_168.data._M_elems._32_8_;
    *(undefined8 *)((this->lastShift).m_backend.data._M_elems + 10) = local_168.data._M_elems._40_8_
    ;
    *(undefined8 *)((this->lastShift).m_backend.data._M_elems + 0xc) =
         local_168.data._M_elems._48_8_;
    *(ulong *)((this->lastShift).m_backend.data._M_elems + 0xe) =
         CONCAT35(local_168.data._M_elems[0xf]._1_3_,local_168.data._M_elems._56_5_);
    (this->lastShift).m_backend.exp = local_168.exp;
    (this->lastShift).m_backend.neg = local_168.neg;
    (this->lastShift).m_backend.fpclass = local_168.fpclass;
    (this->lastShift).m_backend.prec_elem = local_168.prec_elem;
    computeFtest(this);
    iVar4 = extraout_EAX_00;
  }
  if (this->initialized == false) {
    (*this->thepricer->_vptr_SPxPricer[1])(this->thepricer,this);
    iVar4 = (*this->theratiotester->_vptr_SPxRatioTester[1])(this->theratiotester,this);
    this->initialized = true;
  }
  return iVar4;
}

Assistant:

void SPxSolverBase<R>::init()
   {

      assert(thepricer      != nullptr);
      assert(theratiotester != nullptr);

      if(!initialized)
      {
         initialized = true;
         clearUpdateVecs();
         reDim();

         if(SPxBasisBase<R>::status() <= SPxBasisBase<R>::NO_PROBLEM || this->solver() != this)
            SPxBasisBase<R>::load(this);

         initialized = false;
      }

      if(!this->matrixIsSetup)
         SPxBasisBase<R>::loadDesc(this->desc());

      // Inna/Tobi: don't "upgrade" a singular basis to a regular one
      if(SPxBasisBase<R>::status() == SPxBasisBase<R>::SINGULAR)
         return;

      // catch pathological case for LPs with zero constraints
      if(dim() == 0)
      {
         this->factorized = true;
      }

      // we better factorize explicitly before solving
      if(!this->factorized)
      {
         try
         {
            SPxBasisBase<R>::factorize();
         }
         catch(const SPxException&)
         {
            // reload inital slack basis in case the factorization failed
            assert(SPxBasisBase<R>::status() <= SPxBasisBase<R>::SINGULAR);
            SPxBasisBase<R>::restoreInitialBasis();
            SPxBasisBase<R>::factorize();
            assert(this->factorized);
         }
      }

      m_numCycle = 0;

      if(type() == ENTER)
      {
         if(rep() == COLUMN)
         {
            setPrimalBounds();
            setBasisStatus(SPxBasisBase<R>::PRIMAL);
         }
         else
         {
            setDualRowBounds();
            setBasisStatus(SPxBasisBase<R>::DUAL);
         }

         setEnterBounds();
         computeEnterCoPrhs();
         // prepare support vectors for sparse pricing
         infeasibilities.setMax(dim());
         infeasibilitiesCo.setMax(coDim());
         isInfeasible.reSize(dim());
         isInfeasibleCo.reSize(coDim());
         theratiotester->setDelta(entertol());
      }
      else
      {
         if(rep() == ROW)
         {
            setPrimalBounds();
            setBasisStatus(SPxBasisBase<R>::PRIMAL);
         }
         else
         {
            setDualColBounds();
            setBasisStatus(SPxBasisBase<R>::DUAL);
         }

         setLeaveBounds();
         computeLeaveCoPrhs();
         // prepare support vectors for sparse pricing
         infeasibilities.setMax(dim());
         isInfeasible.reSize(dim());
         theratiotester->setDelta(leavetol());
      }

      SPxBasisBase<R>::coSolve(*theCoPvec, *theCoPrhs);
      computePvec();
      computeFrhs();
      SPxBasisBase<R>::solve(*theFvec, *theFrhs);

      theShift = 0.0;

      if(type() == ENTER)
      {
         shiftFvec();
         lastShift = theShift + entertol();

         computeCoTest();
         computeTest();
      }
      else
      {
         shiftPvec();
         lastShift = theShift + leavetol();

         computeFtest();
      }

      if(!initialized)
      {
         // if(thepricer->solver() != this)
         thepricer->load(this);
         // if(theratiotester->solver() != this)
         theratiotester->load(this);
         initialized = true;
      }
   }